

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O3

wchar_t archive_acl_reset(archive_acl *acl,wchar_t want_type)

{
  archive_acl_entry *paVar1;
  wchar_t wVar2;
  archive_acl_entry *paVar3;
  wchar_t wVar4;
  
  paVar1 = acl->acl_head;
  wVar4 = L'\0';
  if (paVar1 != (archive_acl_entry *)0x0) {
    wVar4 = L'\0';
    paVar3 = paVar1;
    do {
      wVar4 = (wVar4 + L'\x01') - (uint)((paVar3->type & want_type) == 0);
      paVar3 = paVar3->next;
    } while (paVar3 != (archive_acl_entry *)0x0);
  }
  wVar2 = wVar4 + L'\x03';
  if (wVar4 == L'\0') {
    wVar2 = wVar4;
  }
  if (((uint)want_type >> 8 & 1) == 0) {
    wVar2 = wVar4;
  }
  wVar4 = L'\0';
  if (((want_type << 0x17) >> 0x1f & 3U) < wVar2) {
    wVar4 = L'✒';
  }
  acl->acl_state = wVar4;
  acl->acl_p = paVar1;
  return wVar2;
}

Assistant:

int
archive_acl_count(struct archive_acl *acl, int want_type)
{
	int count;
	struct archive_acl_entry *ap;

	count = 0;
	ap = acl->acl_head;
	while (ap != NULL) {
		if ((ap->type & want_type) != 0)
			count++;
		ap = ap->next;
	}

	if (count > 0 && ((want_type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0))
		count += 3;
	return (count);
}